

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConsumer.cpp
# Opt level: O3

optional<Vault::AuthenticationResponse> *
Vault::HttpConsumer::authenticate
          (optional<Vault::AuthenticationResponse> *__return_storage_ptr__,Client *client,Url *url,
          NoArgJsonProducer *jsonProducer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  reference pvVar6;
  undefined4 extraout_var_00;
  Token token;
  HttpResponseBodyString body;
  optional<Vault::HttpResponse> response;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  long local_170;
  long local_168 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  size_type *local_138;
  size_type local_130;
  size_type local_128;
  undefined8 uStack_120;
  undefined1 local_118 [16];
  input_adapter local_108;
  _Optional_payload_base<Vault::HttpResponse> local_f8;
  _Any_data local_a8;
  code *local_98;
  undefined8 uStack_90;
  _Optional_payload_base<Vault::HttpResponse> local_80;
  
  iVar5 = (*client->_vptr_Client[10])(client);
  (*client->_vptr_Client[8])(&local_158,client);
  (*client->_vptr_Client[9])(&local_178,client);
  if ((jsonProducer->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  (*jsonProducer->_M_invoker)(&local_198,(_Any_data *)jsonProducer);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x18))
            (&local_f8,(long *)CONCAT44(extraout_var,iVar5),url,&local_158,&local_178,&local_198);
  paVar2 = &local_198.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((long *)local_178._M_current != local_168) {
    operator_delete(local_178._M_current,local_168[0] + 1);
  }
  paVar3 = &local_158.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar3) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) + 1);
  }
  local_80._M_engaged = false;
  if (local_f8._M_engaged == true) {
    std::_Optional_payload_base<Vault::HttpResponse>::_M_construct<Vault::HttpResponse_const&>
              (&local_80,(HttpResponse *)&local_f8);
  }
  bVar4 = HttpClient::is_success((optional<Vault::HttpResponse> *)&local_80);
  if (local_80._M_engaged == true) {
    std::_Optional_payload_base<Vault::HttpResponse>::_M_destroy(&local_80);
  }
  if (bVar4) {
    if (local_f8._M_engaged == false) {
      std::__throw_bad_optional_access();
    }
    local_178._M_current = (char *)local_168;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,local_f8._M_payload._M_value.body.value_._M_dataplus._M_p,
               (pointer)(local_f8._M_payload._M_value.body.value_._M_string_length +
                        (long)local_f8._M_payload._M_value.body.value_._M_dataplus._M_p));
    nlohmann::detail::input_adapter::
    input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
              (&local_108,local_178,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(local_178._M_current + local_170));
    local_98 = (code *)0x0;
    uStack_90 = 0;
    local_a8._M_unused._M_object = (void *)0x0;
    local_a8._8_8_ = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)local_118,&local_108,(parser_callback_t *)&local_a8,true);
    pvVar6 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_118,"auth");
    pvVar6 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)pvVar6,"client_token");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_158,pvVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p == paVar3) {
      local_198.field_2._8_8_ = local_158.field_2._8_8_;
      local_198._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_198._M_dataplus._M_p = local_158._M_dataplus._M_p;
    }
    local_198.field_2._M_allocated_capacity._1_7_ = local_158.field_2._M_allocated_capacity._1_7_;
    local_198.field_2._M_local_buf[0] = local_158.field_2._M_local_buf[0];
    local_198._M_string_length = local_158._M_string_length;
    local_158._M_string_length = 0;
    local_158.field_2._M_local_buf[0] = '\0';
    local_158._M_dataplus._M_p = (pointer)paVar3;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_118);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_118 + 8),(value_t)local_118[0]);
    if (local_98 != (code *)0x0) {
      (*local_98)(&local_a8,&local_a8,__destroy_functor);
    }
    if (local_108.ia.
        super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.ia.
                 super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    local_158._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,local_178._M_current,local_178._M_current + local_170);
    local_138 = &local_128;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,local_198._M_dataplus._M_p,
               local_198._M_dataplus._M_p + local_198._M_string_length);
    paVar1 = &(__return_storage_ptr__->
              super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
              super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
              super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.
              rawResponse.value_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&(__return_storage_ptr__->super__Optional_base<Vault::AuthenticationResponse,_false,_false>
          )._M_payload.super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
          super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload = paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p == paVar3) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,local_158.field_2._M_local_buf[0])
      ;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
               super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
               super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.
               rawResponse.value_.field_2 + 8) = local_158.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->super__Optional_base<Vault::AuthenticationResponse,_false,_false>).
        _M_payload.super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
        super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.rawResponse.
        value_ = local_158._M_dataplus._M_p;
      (__return_storage_ptr__->super__Optional_base<Vault::AuthenticationResponse,_false,_false>).
      _M_payload.super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
      super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.rawResponse.
      value_.field_2._M_allocated_capacity =
           CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,local_158.field_2._M_local_buf[0])
      ;
    }
    (__return_storage_ptr__->super__Optional_base<Vault::AuthenticationResponse,_false,_false>).
    _M_payload.super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
    super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.rawResponse.
    value_._M_string_length = local_158._M_string_length;
    local_158._M_string_length = 0;
    local_158.field_2._M_local_buf[0] = '\0';
    paVar1 = &(__return_storage_ptr__->
              super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
              super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
              super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.token.
              value_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)((long)&(__return_storage_ptr__->
                 super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
                 super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
                 super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload + 0x20) =
         paVar1;
    if (local_138 == &local_128) {
      paVar1->_M_allocated_capacity = local_128;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<Vault::AuthenticationResponse,_false,_false>)._M_payload.
               super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
               super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.token
               .value_.field_2 + 8) = uStack_120;
    }
    else {
      (__return_storage_ptr__->super__Optional_base<Vault::AuthenticationResponse,_false,_false>).
      _M_payload.super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
      super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.token.value_.
      _M_dataplus._M_p = (pointer)local_138;
      (__return_storage_ptr__->super__Optional_base<Vault::AuthenticationResponse,_false,_false>).
      _M_payload.super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
      super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.token.value_.
      field_2._M_allocated_capacity = local_128;
    }
    (__return_storage_ptr__->super__Optional_base<Vault::AuthenticationResponse,_false,_false>).
    _M_payload.super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
    super__Optional_payload_base<Vault::AuthenticationResponse>._M_payload._M_value.token.value_.
    _M_string_length = local_130;
    (__return_storage_ptr__->super__Optional_base<Vault::AuthenticationResponse,_false,_false>).
    _M_payload.super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
    super__Optional_payload_base<Vault::AuthenticationResponse>._M_engaged = true;
    local_158._M_dataplus._M_p = (pointer)paVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_178._M_current != local_168) {
      operator_delete(local_178._M_current,local_168[0] + 1);
    }
  }
  else {
    if (local_f8._M_engaged == true) {
      iVar5 = (*client->_vptr_Client[10])(client);
      if (local_f8._M_engaged == false) {
        std::__throw_bad_optional_access();
      }
      HttpClient::handleResponseError
                ((HttpClient *)CONCAT44(extraout_var_00,iVar5),(HttpResponse *)&local_f8);
    }
    (__return_storage_ptr__->super__Optional_base<Vault::AuthenticationResponse,_false,_false>).
    _M_payload.super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
    super__Optional_payload_base<Vault::AuthenticationResponse>._M_engaged = false;
  }
  if (local_f8._M_engaged == true) {
    std::_Optional_payload_base<Vault::HttpResponse>::_M_destroy(&local_f8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<Vault::AuthenticationResponse>
Vault::HttpConsumer::authenticate(const Vault::Client &client,
                                  const Vault::Url &url,
                                  const NoArgJsonProducer &jsonProducer) {
  auto response = client.getHttpClient().post(
      url, client.getToken(), client.getNamespace(), jsonProducer());

  if (HttpClient::is_success(response)) {
    auto body = Vault::HttpResponseBodyString{response.value().body};
    auto token = Vault::Token{
        nlohmann::json::parse(body.value())["auth"]["client_token"]};

    return AuthenticationResponse{body, token};
  }

  if (response) {
    client.getHttpClient().handleResponseError(response.value());
  }

  return std::nullopt;
}